

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltexceptions.h
# Opt level: O3

void __thiscall bad_vulkan_alloc::bad_vulkan_alloc(bad_vulkan_alloc *this,int which,char *_message)

{
  undefined1 *puVar1;
  size_t sVar2;
  ostream *poVar3;
  char *pcVar4;
  string memtype;
  char *local_50;
  long local_48;
  char local_40;
  undefined7 uStack_3f;
  
  *(undefined ***)this = &PTR__bad_vulkan_alloc_00193bc0;
  std::__cxx11::stringstream::stringstream((stringstream *)&this->message);
  (this->_what)._M_dataplus._M_p = (pointer)&(this->_what).field_2;
  (this->_what)._M_string_length = 0;
  (this->_what).field_2._M_local_buf[0] = '\0';
  if (which == -0xc) {
    puVar1 = &this->field_0x18;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)puVar1,"Pool fragmented when allocating for ",0x24);
    if (_message == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(*(long *)puVar1 + -0x18) + (int)puVar1);
    }
    else {
      sVar2 = strlen(_message);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,_message,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,".",1);
    goto LAB_0012f1c0;
  }
  local_48 = 0;
  local_40 = '\0';
  local_50 = &local_40;
  if (which == -0x3b9bd788) {
    pcVar4 = "pool";
LAB_0012f109:
    std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,(ulong)pcVar4);
  }
  else {
    if (which == -2) {
      pcVar4 = "device";
      goto LAB_0012f109;
    }
    if (which == -1) {
      pcVar4 = "host";
      goto LAB_0012f109;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x18,"Out of ",7);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x18,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," memory for ",0xc);
  if (_message == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar2 = strlen(_message);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,_message,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
LAB_0012f1c0:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->_what,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

bad_vulkan_alloc(int which, const char* _message) : std::bad_alloc() {
        if (which == FRAGMENTED_POOL) {
            message << "Pool fragmented when allocating for " << _message << ".";
        } else {
          std::string memtype;
            switch (which) {
              case OUT_OF_HOST_MEMORY: memtype = "host"; break;
              case OUT_OF_DEVICE_MEMORY: memtype = "device"; break;
              case OUT_OF_POOL_MEMORY: memtype = "pool"; break;
              default: break;
            }
            message << "Out of " << memtype << " memory for " << _message << ".";
        }
        _what = message.str();
    }